

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<float> fmt::v11::detail::dragonbox::to_decimal<float>(float x)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  
  uVar13 = (uint)x & 0x7fffff;
  uVar6 = (uint)x >> 0x17 & 0xff;
  if (uVar6 == 0) {
    uVar6 = 0xffffff6b;
    if (uVar13 == 0) {
      uVar9 = 0;
      uVar10 = 0;
      goto LAB_0013d76d;
    }
LAB_0013d575:
    uVar9 = (int)(uVar6 * 0x4d105) >> 0x14;
    uVar10 = (ulong)uVar9;
    uVar12 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                       (ulong)(0x20 - uVar9) * 8);
    bVar4 = (char)((int)((1 - uVar9) * 0x1a934f) >> 0x13) + (char)uVar6;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar12;
    auVar1 = (ZEXT416(uVar13 * 2 + 1 << (bVar4 & 0x1f)) << 0x20) * auVar1;
    uVar5 = auVar1._8_8_ >> 0x20;
    uVar3 = uVar5 / 100;
    iVar2 = (int)(uVar5 / 100);
    iVar7 = (int)(uVar5 / 100);
    uVar6 = iVar7 * -100 + auVar1._12_4_;
    uVar11 = (uint)(uVar12 >> (~bVar4 & 0x3f));
    if (uVar6 < uVar11) {
      if ((uVar6 != 0) || ((auVar1._8_4_ != 0 || ((uVar13 & 1) == 0)))) {
LAB_0013d62b:
        iVar7 = uVar9 - 1;
        do {
          uVar6 = (uint)uVar3;
          uVar13 = uVar6 * 0x40000000 | uVar6 * -0x3d70a3d7 >> 2;
          uVar3 = (ulong)uVar13;
          iVar7 = iVar7 + 2;
        } while (uVar13 < 0x28f5c29);
        uVar9 = uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f;
        bVar14 = uVar9 < 0x1999999a;
        if (!bVar14) {
          uVar9 = uVar6;
        }
        goto LAB_0013d76a;
      }
      iVar2 = iVar7 + -1;
      uVar6 = 100;
    }
    else if ((uVar6 <= uVar11) &&
            (uVar5 = (uVar13 * 2 - 1) * uVar12,
            ((uint)((int)(uVar5 >> (-(bVar4 + 0x20) & 0x3f)) == 0) & ~uVar13) != 0 ||
            (uVar5 >> ((ulong)(byte)(0x40 - bVar4) & 0x3f) & 1) != 0)) goto LAB_0013d62b;
    iVar7 = uVar6 - (uVar11 >> 1);
    uVar6 = iVar7 * 0x199a + 0x8002;
    uVar9 = (uVar6 >> 0x10) + iVar2 * 10;
    if ((uVar6 & 0xffff) < 0x199a) {
      uVar12 = uVar12 * (uVar13 * 2);
      if (((uVar12 >> ((ulong)(byte)(0x40 - bVar4) & 0x3f) & 1) != 0) == (bool)((byte)iVar7 & 1)) {
        uVar9 = uVar9 - ((byte)(uVar6 >> 0x10) & 1 & (int)(uVar12 >> (-(bVar4 + 0x20) & 0x3f)) == 0)
        ;
      }
      else {
        uVar9 = uVar9 - 1;
      }
    }
  }
  else {
    uVar6 = uVar6 - 0x96;
    if (uVar13 != 0) {
      uVar13 = uVar13 | 0x800000;
      goto LAB_0013d575;
    }
    uVar13 = (int)(uVar6 * 0x9a209 + -0x3fe1f) >> 0x15;
    uVar10 = (ulong)uVar13;
    cVar8 = (char)((int)(uVar13 * -0x1a934f) >> 0x13) + (char)uVar6;
    uVar12 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                       (ulong)(0x1f - uVar13) * 8);
    bVar4 = 0x28 - cVar8;
    uVar11 = (uint)((uVar6 & 0xfffffffe) != 2) + (int)(uVar12 - (uVar12 >> 0x19) >> (bVar4 & 0x3f));
    uVar5 = (uVar12 >> 0x18) + uVar12 >> (bVar4 & 0x3f) & 0xffffffff;
    uVar3 = uVar5 / 10;
    if ((uint)((int)(uVar5 / 10) * 10) < uVar11) {
      uVar9 = (int)(uVar12 >> (0x27U - cVar8 & 0x3f)) + 1U >> 1;
      if (uVar6 == 0xffffffdd) {
        uVar9 = uVar9 & 0xfffffffe;
      }
      else {
        uVar9 = uVar9 + (uVar9 < uVar11);
      }
      goto LAB_0013d76d;
    }
    iVar7 = uVar13 - 1;
    do {
      uVar6 = (uint)uVar3;
      uVar13 = uVar6 * 0x40000000 | uVar6 * -0x3d70a3d7 >> 2;
      uVar3 = (ulong)uVar13;
      iVar7 = iVar7 + 2;
    } while (uVar13 < 0x28f5c29);
    uVar9 = uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f;
    bVar14 = uVar9 < 0x1999999a;
    if (!bVar14) {
      uVar9 = uVar6;
    }
LAB_0013d76a:
    uVar10 = (ulong)(iVar7 + (uint)bVar14);
  }
LAB_0013d76d:
  return (decimal_fp<float>)((ulong)uVar9 | uVar10 << 0x20);
}

Assistant:

auto small_division_by_pow10(uint32_t n) noexcept -> uint32_t {
  constexpr auto info = div_small_pow10_infos[N - 1];
  FMT_ASSERT(n <= info.divisor * 10, "n is too large");
  constexpr uint32_t magic_number =
      (1u << info.shift_amount) / info.divisor + 1;
  return (n * magic_number) >> info.shift_amount;
}